

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getRx(Nibbler *this,string *regex,string *result)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string modified_regex;
  RX r;
  
  if (this->_cursor < this->_length) {
    modified_regex._M_dataplus._M_p = (pointer)&modified_regex.field_2;
    modified_regex._M_string_length = 0;
    modified_regex.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::substr((ulong)&r,(ulong)regex);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                            "^(");
    std::__cxx11::string::~string((string *)&r);
    if (bVar1) {
      std::operator+(&local_d0,"^(",regex);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                     &local_d0,")");
      std::__cxx11::string::operator=((string *)&modified_regex,(string *)&r);
      std::__cxx11::string::~string((string *)&r);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&modified_regex);
    }
    RX::RX(&r,&modified_regex,true);
    results.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    results.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    results.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)this);
    bVar1 = RX::match(&r,&results,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)result);
      this->_cursor = this->_cursor + result->_M_string_length;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&results);
      RX::~RX(&r);
      std::__cxx11::string::~string((string *)&modified_regex);
      return true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&results);
    RX::~RX(&r);
    std::__cxx11::string::~string((string *)&modified_regex);
  }
  return false;
}

Assistant:

bool Nibbler::getRx (const std::string& regex, std::string& result)
{
  if (_cursor < _length)
  {
    // Regex may be anchored to the beginning and include capturing parentheses,
    // otherwise they are added.
    std::string modified_regex;
    if (regex.substr (0, 2) != "^(")
      modified_regex = "^(" + regex + ")";
    else
      modified_regex = regex;

    RX r (modified_regex, true);
    std::vector <std::string> results;
    if (r.match (results, _input.substr (_cursor)))
    {
      result = results[0];
      _cursor += result.length ();
      return true;
    }
  }

  return false;
}